

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O2

void Game::tumbleTilesDownOnGameboard(GameBoard *gb)

{
  ull uVar1;
  point2D_t *pt;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  pointer ptVar5;
  undefined1 local_88 [16];
  pointer local_78;
  _Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
  local_70;
  _Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
  local_50;
  
  std::_Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>::
  _Tuple_impl(&local_50,
              (_Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
               *)gb);
  std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
            ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)&local_50);
  uVar2 = 0;
  uVar4 = (ulong)(uint)local_50.super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  if ((int)(uint)local_50.super__Head_base<0UL,_unsigned_long,_false>._M_head_impl < 1) {
    uVar4 = uVar2;
  }
  for (; uVar2 != uVar4; uVar2 = uVar2 + 1) {
    for (uVar3 = (uint)local_50.super__Head_base<0UL,_unsigned_long,_false>._M_head_impl - 2;
        -1 < (int)uVar3; uVar3 = uVar3 - 1) {
      ptVar5 = (pointer)((ulong)uVar3 | uVar2 << 0x20);
      std::
      _Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>::
      _Tuple_impl(&local_70,
                  (_Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
                   *)gb);
      local_88._0_8_ = ptVar5;
      uVar1 = anon_unknown_0::getTileValueOnGameboardDataArray
                        ((anon_unknown_0 *)&local_70,(gameboard_data_array_t *)local_88,pt);
      std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
                ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)&local_70);
      if (uVar1 != 0) {
        local_78 = (pointer)0x1;
        local_88._8_8_ = ptVar5;
        anon_unknown_0::moveOnGameboard(gb,(delta_t *)(local_88 + 8));
      }
    }
  }
  return;
}

Assistant:

void tumbleTilesDownOnGameboard(GameBoard &gb) {
  doTumbleTilesDownOnGameboard(gb);
}